

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectoringNozzleSystemData.h
# Opt level: O0

void __thiscall
DIS::VectoringNozzleSystemData::VectoringNozzleSystemData
          (VectoringNozzleSystemData *this,VectoringNozzleSystemData *param_1)

{
  float fVar1;
  VectoringNozzleSystemData *param_1_local;
  VectoringNozzleSystemData *this_local;
  
  this->_vptr_VectoringNozzleSystemData = (_func_int **)&PTR__VectoringNozzleSystemData_002737f8;
  fVar1 = param_1->_verticalDeflectionAngle;
  this->_horizontalDeflectionAngle = param_1->_horizontalDeflectionAngle;
  this->_verticalDeflectionAngle = fVar1;
  return;
}

Assistant:

class OPENDIS6_EXPORT VectoringNozzleSystemData
{
protected:
  /** horizontal deflection angle */
  float _horizontalDeflectionAngle; 

  /** vertical deflection angle */
  float _verticalDeflectionAngle; 


 public:
    VectoringNozzleSystemData();
    virtual ~VectoringNozzleSystemData();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    float getHorizontalDeflectionAngle() const; 
    void setHorizontalDeflectionAngle(float pX); 

    float getVerticalDeflectionAngle() const; 
    void setVerticalDeflectionAngle(float pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const VectoringNozzleSystemData& rhs) const;
}